

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O0

_Bool check_mat_mul(ggml_tensor *y,ggml_tensor *x0,ggml_tensor *x1)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int64_t iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  float fVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  int k;
  float sum;
  int i0;
  int i1;
  int i2;
  int i3;
  int i_2;
  int j_2;
  int i_1;
  int j_1;
  int i;
  int j;
  int64_t n32;
  int64_t n22;
  int64_t n12;
  int64_t n02;
  int64_t n31;
  int64_t n21;
  int64_t n11;
  int64_t n01;
  int64_t n30;
  int64_t n20;
  int64_t n10;
  int64_t n00;
  int local_a8;
  float local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined1 extraout_var [60];
  
  lVar1 = in_RSI->ne[0];
  lVar2 = in_RSI->ne[1];
  lVar3 = in_RDX->ne[0];
  lVar4 = in_RDX->ne[1];
  iVar5 = in_RDX->ne[2];
  lVar6 = in_RDI->ne[0];
  lVar7 = in_RDI->ne[1];
  lVar8 = in_RDI->ne[2];
  lVar9 = in_RDI->ne[3];
  printf("x0: [%ld, %ld, %ld, %ld]\n",lVar1,lVar2,in_RSI->ne[2]);
  for (local_7c = 0; local_7c < lVar2; local_7c = local_7c + 1) {
    for (local_80 = 0; local_80 < lVar1; local_80 = local_80 + 1) {
      mat_get(in_RSI,local_80,local_7c,0,0);
      printf("%6.3f ");
    }
    printf("\n");
  }
  printf("\n");
  printf("x1: [%ld, %ld, %ld, %ld]\n",lVar3,lVar4,iVar5);
  for (local_84 = 0; local_84 < lVar4; local_84 = local_84 + 1) {
    for (local_88 = 0; local_88 < lVar3; local_88 = local_88 + 1) {
      mat_get(in_RDX,local_88,local_84,0,0);
      printf("%6.3f ");
    }
    printf("\n");
  }
  printf("\n");
  printf("y: [%ld, %ld, %ld, %ld]\n",lVar6,lVar7,lVar8);
  for (local_8c = 0; local_8c < lVar7; local_8c = local_8c + 1) {
    for (local_90 = 0; local_90 < lVar6; local_90 = local_90 + 1) {
      mat_get(in_RDI,local_90,local_8c,0,0);
      printf("%6.3f ");
    }
    printf("\n");
  }
  local_94 = 0;
  do {
    if (lVar9 <= (int)local_94) {
      return true;
    }
    for (local_98 = 0; (int)local_98 < lVar8; local_98 = local_98 + 1) {
      for (local_9c = 0; (int)local_9c < lVar7; local_9c = local_9c + 1) {
        for (local_a0 = 0; (int)local_a0 < lVar6; local_a0 = local_a0 + 1) {
          local_a4 = 0.0;
          for (local_a8 = 0; local_a8 < lVar1; local_a8 = local_a8 + 1) {
            fVar10 = mat_get(in_RSI,local_a8,local_a0,local_98,local_94);
            auVar11._0_4_ = mat_get(in_RDX,local_a8,local_9c,local_98,local_94);
            auVar11._4_60_ = extraout_var;
            auVar12 = vfmadd213ss_fma(auVar11._0_16_,ZEXT416((uint)fVar10),ZEXT416((uint)local_a4));
            local_a4 = auVar12._0_4_;
          }
          fVar10 = mat_get(in_RDI,local_a0,local_9c,local_98,local_94);
          auVar12._8_4_ = 0x7fffffff;
          auVar12._0_8_ = 0x7fffffff7fffffff;
          auVar12._12_4_ = 0x7fffffff;
          auVar12 = vpand_avx(ZEXT416((uint)(local_a4 - fVar10)),auVar12);
          if (1e-05 < auVar12._0_4_) {
            fVar10 = mat_get(in_RDI,local_a0,local_9c,local_98,local_94);
            printf("error: i0=%d, i1=%d, i2=%d, i3=%d, sum=%f, y=%f\n",(double)local_a4,
                   (double)fVar10,(ulong)local_a0,(ulong)local_9c,(ulong)local_98,(ulong)local_94);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                          ,0xdc,
                          "_Bool check_mat_mul(const struct ggml_tensor *, const struct ggml_tensor *, const struct ggml_tensor *)"
                         );
          }
        }
      }
    }
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

bool check_mat_mul(
        const struct ggml_tensor * y,
        const struct ggml_tensor * x0,
        const struct ggml_tensor * x1) {
    const int64_t n00 = x0->ne[0];
    const int64_t n10 = x0->ne[1];
    const int64_t n20 = x0->ne[2];
    const int64_t n30 = x0->ne[3];

    const int64_t n01 = x1->ne[0];
    const int64_t n11 = x1->ne[1];
    const int64_t n21 = x1->ne[2];
    const int64_t n31 = x1->ne[3];

    const int64_t n02 = y->ne[0];
    const int64_t n12 = y->ne[1];
    const int64_t n22 = y->ne[2];
    const int64_t n32 = y->ne[3];

    printf("x0: [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n", n00, n10, n20, n30);
    for (int j = 0; j < n10; ++j) {
        for (int i = 0; i < n00; ++i) {
            printf("%6.3f ", mat_get(x0, i, j, 0, 0));
        }
        printf("\n");
    }
    printf("\n");

    printf("x1: [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n", n01, n11, n21, n31);
    for (int j = 0; j < n11; ++j) {
        for (int i = 0; i < n01; ++i) {
            printf("%6.3f ", mat_get(x1, i, j, 0, 0));
        }
        printf("\n");
    }
    printf("\n");

    printf("y: [%" PRId64 ", %" PRId64 ", %" PRId64 ", %" PRId64 "]\n", n02, n12, n22, n32);
    for (int j = 0; j < n12; ++j) {
        for (int i = 0; i < n02; ++i) {
            printf("%6.3f ", mat_get(y, i, j, 0, 0));
        }
        printf("\n");
    }

    for (int i3 = 0; i3 < n32; ++i3) {
        for (int i2 = 0; i2 < n22; ++i2) {
            for (int i1 = 0; i1 < n12; ++i1) {
                for (int i0 = 0; i0 < n02; ++i0) {
                    float sum = 0.0f;
                    for (int k = 0; k < n00; ++k) {
                        sum += mat_get(x0, k, i0, i2, i3) * mat_get(x1, k, i1, i2, i3);
                    }
                    if (fabsf(sum - mat_get(y, i0, i1, i2, i3)) > 1e-5) {
                        printf("error: i0=%d, i1=%d, i2=%d, i3=%d, sum=%f, y=%f\n",
                                i0, i1, i2, i3, sum, mat_get(y, i0, i1, i2, i3));
                        assert(false);
                        return false;
                    }
                }
            }
        }
    }

    return true;
}